

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

yyjson_mut_val *
duckdb_yyjson::yyjson_merge_patch(yyjson_mut_doc *doc,yyjson_val *orig,yyjson_val *patch)

{
  yyjson_val_pool *pool;
  ulong uVar1;
  void *pvVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  yyjson_mut_val *pyVar7;
  yyjson_mut_val *pyVar8;
  char *pcVar9;
  yyjson_mut_val *pyVar10;
  ulong uVar11;
  yyjson_val *pyVar12;
  yyjson_mut_val *pyVar13;
  ulong uVar14;
  yyjson_val *pyVar15;
  yyjson_val *pyVar16;
  yyjson_val *pyVar17;
  ulong uVar18;
  yyjson_val local_orig;
  yyjson_val *local_38;
  
  if ((patch == (yyjson_val *)0x0) || ((~(uint)patch->tag & 7) != 0)) {
    pyVar10 = yyjson_val_mut_copy(doc,patch);
    return pyVar10;
  }
  if (doc != (yyjson_mut_doc *)0x0) {
    pool = &doc->val_pool;
    pyVar10 = (doc->val_pool).cur;
    if ((doc->val_pool).end == pyVar10) {
      bVar4 = unsafe_yyjson_val_pool_grow(pool,&doc->alc,1);
      if (!bVar4) {
        return (yyjson_mut_val *)0x0;
      }
      pyVar10 = pool->cur;
    }
    pool->cur = pyVar10 + 1;
    if (pyVar10 != (yyjson_mut_val *)0x0) {
      pyVar10->tag = 7;
      local_orig.tag = 0;
      local_orig.uni.u64 = 0;
      if ((orig == (yyjson_val *)0x0) || (uVar1 = orig->tag, (~(uint)uVar1 & 7) != 0)) {
        pyVar12 = (yyjson_val *)&local_38;
        local_orig.tag = pyVar10->tag;
        local_orig.uni = pyVar10->uni;
        orig = &local_orig;
      }
      else {
        pyVar12 = orig + 1;
        if ((&local_orig != orig) && (0xff < uVar1)) {
          pyVar16 = orig + 2;
          local_38 = patch + 1;
          uVar11 = 0;
          pyVar15 = pyVar12;
          do {
            pvVar2 = (pyVar15->uni).ptr;
            uVar14 = patch->tag;
            if ((0xff < uVar14 && pvVar2 != (void *)0x0) && (~(uint)uVar14 & 7) == 0) {
              uVar18 = pyVar15->tag >> 8;
              uVar14 = uVar14 >> 8;
              pyVar17 = local_38;
              do {
                if ((pyVar17->tag >> 8 == uVar18) &&
                   (iVar6 = bcmp((pyVar17->uni).ptr,pvVar2,uVar18), iVar6 == 0)) goto LAB_00cd6e23;
                pcVar9 = (char *)0x10;
                if ((~(uint)pyVar17[1].tag & 6) == 0) {
                  pcVar9 = pyVar17[1].uni.str;
                }
                pyVar17 = (yyjson_val *)(pcVar9 + (long)(pyVar17 + 1));
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
            pyVar7 = yyjson_val_mut_copy(doc,pyVar15);
            pyVar8 = yyjson_val_mut_copy(doc,pyVar16);
            if (pyVar7 == (yyjson_mut_val *)0x0) {
              return (yyjson_mut_val *)0x0;
            }
            uVar14 = pyVar10->tag;
            if (((uint)uVar14 & 7) != 7) {
              return (yyjson_mut_val *)0x0;
            }
            if (pyVar8 == (yyjson_mut_val *)0x0) {
              return (yyjson_mut_val *)0x0;
            }
            if (((uint)pyVar7->tag & 7) != 5) {
              return (yyjson_mut_val *)0x0;
            }
            pyVar13 = pyVar7;
            if (0xff < uVar14) {
              lVar3 = *(long *)((pyVar10->uni).u64 + 0x10);
              pyVar13 = *(yyjson_mut_val **)(lVar3 + 0x10);
              *(yyjson_mut_val **)(lVar3 + 0x10) = pyVar7;
            }
            pyVar8->next = pyVar13;
            pyVar7->next = pyVar8;
            (pyVar10->uni).str = (char *)pyVar7;
            pyVar10->tag = (uVar14 & 0xff) + (uVar14 & 0xffffffffffffff00) + 0x100;
LAB_00cd6e23:
            pcVar9 = (char *)0x10;
            if ((~(uint)pyVar16->tag & 6) == 0) {
              pcVar9 = pyVar15[1].uni.str;
            }
            uVar11 = uVar11 + 1;
            pyVar15 = (yyjson_val *)(pcVar9 + (long)&pyVar16->tag);
            pyVar16 = (yyjson_val *)(pcVar9 + (long)(pyVar16 + 1));
          } while (uVar11 != uVar1 >> 8);
        }
      }
      uVar1 = patch->tag;
      if ((~(uint)uVar1 & 7) != 0) {
        return pyVar10;
      }
      if (uVar1 < 0x100) {
        return pyVar10;
      }
      pyVar15 = patch + 1;
      pyVar16 = patch + 2;
      uVar11 = 0;
      do {
        uVar5 = (uint)pyVar16->tag;
        if ((uVar5 & 7) != 2) {
          pyVar7 = yyjson_val_mut_copy(doc,pyVar15);
          pvVar2 = (pyVar15->uni).ptr;
          uVar14 = orig->tag;
          if ((uVar14 < 0x100 || pvVar2 == (void *)0x0) || (~(uint)uVar14 & 7) != 0) {
            pyVar17 = (yyjson_val *)0x0;
          }
          else {
            uVar18 = pyVar15->tag >> 8;
            uVar14 = uVar14 >> 8;
            pyVar17 = pyVar12;
            do {
              if (((ulong)pyVar17->tag >> 8 == uVar18) &&
                 (iVar6 = bcmp((pyVar17->uni).ptr,pvVar2,uVar18), iVar6 == 0)) {
                pyVar17 = pyVar17 + 1;
                goto LAB_00cd6ffa;
              }
              pcVar9 = (char *)0x10;
              if ((~(uint)pyVar17[1].tag & 6) == 0) {
                pcVar9 = pyVar17[1].uni.str;
              }
              pyVar17 = (yyjson_val *)(pcVar9 + (long)(pyVar17 + 1));
              uVar14 = uVar14 - 1;
            } while (uVar14 != 0);
            pyVar17 = (yyjson_val *)0x0;
          }
LAB_00cd6ffa:
          pyVar8 = yyjson_merge_patch(doc,pyVar17,pyVar16);
          if (pyVar7 == (yyjson_mut_val *)0x0) {
            return (yyjson_mut_val *)0x0;
          }
          uVar14 = pyVar10->tag;
          if (((uint)uVar14 & 7) != 7) {
            return (yyjson_mut_val *)0x0;
          }
          if (pyVar8 == (yyjson_mut_val *)0x0) {
            return (yyjson_mut_val *)0x0;
          }
          if (((uint)pyVar7->tag & 7) != 5) {
            return (yyjson_mut_val *)0x0;
          }
          pyVar13 = pyVar7;
          if (0xff < uVar14) {
            lVar3 = *(long *)((pyVar10->uni).u64 + 0x10);
            pyVar13 = *(yyjson_mut_val **)(lVar3 + 0x10);
            *(yyjson_mut_val **)(lVar3 + 0x10) = pyVar7;
          }
          pyVar8->next = pyVar13;
          pyVar7->next = pyVar8;
          (pyVar10->uni).str = (char *)pyVar7;
          pyVar10->tag = (uVar14 & 0xff) + (uVar14 & 0xffffffffffffff00) + 0x100;
          uVar5 = (uint)pyVar16->tag;
        }
        pcVar9 = (char *)0x10;
        if ((~uVar5 & 6) == 0) {
          pcVar9 = pyVar15[1].uni.str;
        }
        uVar11 = uVar11 + 1;
        pyVar15 = (yyjson_val *)(pcVar9 + (long)&pyVar16->tag);
        pyVar16 = (yyjson_val *)(pcVar9 + (long)(pyVar16 + 1));
        if (uVar11 == uVar1 >> 8) {
          return pyVar10;
        }
      } while( true );
    }
  }
  return (yyjson_mut_val *)0x0;
}

Assistant:

yyjson_mut_val *yyjson_merge_patch(yyjson_mut_doc *doc,
                                   yyjson_val *orig,
                                   yyjson_val *patch) {
    usize idx, max;
    yyjson_val *key, *orig_val, *patch_val, local_orig;
    yyjson_mut_val *builder, *mut_key, *mut_val, *merged_val;

    if (unlikely(!yyjson_is_obj(patch))) {
        return yyjson_val_mut_copy(doc, patch);
    }

    builder = yyjson_mut_obj(doc);
    if (unlikely(!builder)) return NULL;

    memset(&local_orig, 0, sizeof(local_orig));
    if (!yyjson_is_obj(orig)) {
        orig = &local_orig;
        orig->tag = builder->tag;
        orig->uni = builder->uni;
    }

    /* If orig is contributing, copy any items not modified by the patch */
    if (orig != &local_orig) {
        yyjson_obj_foreach(orig, idx, max, key, orig_val) {
            patch_val = yyjson_obj_getn(patch,
                                        unsafe_yyjson_get_str(key),
                                        unsafe_yyjson_get_len(key));
            if (!patch_val) {
                mut_key = yyjson_val_mut_copy(doc, key);
                mut_val = yyjson_val_mut_copy(doc, orig_val);
                if (!yyjson_mut_obj_add(builder, mut_key, mut_val)) return NULL;
            }
        }
    }

    /* Merge items modified by the patch. */
    yyjson_obj_foreach(patch, idx, max, key, patch_val) {
        /* null indicates the field is removed. */
        if (unsafe_yyjson_is_null(patch_val)) {
            continue;
        }
        mut_key = yyjson_val_mut_copy(doc, key);
        orig_val = yyjson_obj_getn(orig,
                                   unsafe_yyjson_get_str(key),
                                   unsafe_yyjson_get_len(key));
        merged_val = yyjson_merge_patch(doc, orig_val, patch_val);
        if (!yyjson_mut_obj_add(builder, mut_key, merged_val)) return NULL;
    }

    return builder;
}